

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O0

void printf_test(void)

{
  array_container_t *paVar1;
  array_container_t *B;
  char *in_stack_00000008;
  unsigned_long in_stack_00000010;
  uint16_t value;
  
  paVar1 = array_container_create();
  _assert_true(in_stack_00000010,in_stack_00000008,(char *)B,(int)((ulong)paVar1 >> 0x20));
  value = (uint16_t)((ulong)paVar1 >> 0x30);
  array_container_add(B,value);
  array_container_add(B,value);
  array_container_add(B,value);
  array_container_add(B,value);
  array_container_add(B,value);
  array_container_printf(B);
  printf("\n");
  array_container_free((array_container_t *)0x10308c);
  return;
}

Assistant:

DEFINE_TEST(printf_test) {
    array_container_t* B = array_container_create();
    assert_non_null(B);

    array_container_add(B, 1U);
    array_container_add(B, 2U);
    array_container_add(B, 3U);
    array_container_add(B, 10U);
    array_container_add(B, 10000U);

    array_container_printf(B);
    printf("\n");

    array_container_free(B);
}